

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultilineTextBox.cpp
# Opt level: O2

void __thiscall
gui::MultilineTextBox::handleMousePress(MultilineTextBox *this,Button button,Vector2f *mouseParent)

{
  size_t caretOffset;
  Vector2f mouseLocal;
  Vector2f local_20;
  
  Widget::handleMousePress(&this->super_Widget,button,mouseParent);
  local_20 = Widget::toLocalOriginSpace(&this->super_Widget,mouseParent);
  if (button == Left) {
    caretOffset = findClosestOffsetToMouse(this,&local_20);
    updateCaretPosition(this,caretOffset,false);
  }
  else if (2 < (int)button) goto LAB_0013dae7;
  Signal<gui::Widget_*,_const_sf::Vector2<float>_&>::emit
            (&this->onClick,&this->super_Widget,&local_20);
LAB_0013dae7:
  Signal<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&>::emit
            (&this->onMousePress,&this->super_Widget,button,&local_20);
  return;
}

Assistant:

void MultilineTextBox::handleMousePress(sf::Mouse::Button button, const sf::Vector2f& mouseParent) {
    baseClass::handleMousePress(button, mouseParent);
    const auto mouseLocal = toLocalOriginSpace(mouseParent);
    if (button == sf::Mouse::Left) {
        updateCaretPosition(findClosestOffsetToMouse(mouseLocal), false);
    }
    if (button <= sf::Mouse::Middle) {
        onClick.emit(this, mouseLocal);
    }
    onMousePress.emit(this, button, mouseLocal);
}